

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O0

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_visitVarType<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *varType)

{
  DataLocation *loc;
  DataTypeSet *dts;
  ulong uVar1;
  Size SVar2;
  socklen_t *__addr_len;
  mapped_type *pmVar3;
  Option *this_00;
  DataType *this_01;
  sockaddr *__addr;
  VariantWithIntegerSelectorType<unsigned_long_long> *local_30;
  VariantWithIntegerSelectorType<unsigned_long_long> *local_28;
  uint local_1c;
  VariantWithIntegerSelectorType<unsigned_long_long> *pVStack_18;
  uint i;
  VariantWithUnsignedIntegerSelectorType *varType_local;
  SetKeyDtsDtVisitor *this_local;
  
  pVStack_18 = &varType->super_VariantWithIntegerSelectorType<unsigned_long_long>;
  varType_local = (VariantWithUnsignedIntegerSelectorType *)this;
  loc = VariantType::selectorLocation((VariantType *)varType);
  dts = TraceTypeImpl::varOptTypeSelTypes<yactfr::VariantWithUnsignedIntegerSelectorType>
                  ((VariantWithUnsignedIntegerSelectorType *)pVStack_18);
  _setKeyDts(this,loc,dts);
  local_1c = 0;
  while( true ) {
    uVar1 = (ulong)local_1c;
    SVar2 = VariantWithIntegerSelectorType<unsigned_long_long>::size(pVStack_18);
    if (SVar2 <= uVar1) break;
    __addr_len = (socklen_t *)(ulong)local_1c;
    local_28 = pVStack_18;
    pmVar3 = std::
             unordered_map<const_yactfr::DataType_*,_unsigned_long_long,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>_>
             ::operator[](&this->_current,(key_type *)&local_28);
    *pmVar3 = (mapped_type)__addr_len;
    this_00 = VariantWithIntegerSelectorType<unsigned_long_long>::operator[]
                        (pVStack_18,(ulong)local_1c);
    this_01 = VariantTypeOption<unsigned_long_long>::dataType(this_00);
    DataType::accept(this_01,(int)this,__addr,__addr_len);
    local_1c = local_1c + 1;
  }
  local_30 = pVStack_18;
  std::
  unordered_map<const_yactfr::DataType_*,_unsigned_long_long,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>_>
  ::erase(&this->_current,(key_type *)&local_30);
  return;
}

Assistant:

void _visitVarType(const VarTypeT& varType)
    {
        this->_setKeyDts(varType.selectorLocation(), TraceTypeImpl::varOptTypeSelTypes(varType));

        for (auto i = 0U; i < varType.size(); ++i) {
            // currently being visited
            _current[&varType] = i;

            varType[i].dataType().accept(*this);
        }

        // not visited anymore
        _current.erase(&varType);
    }